

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O1

void __thiscall
cmGeneratedFileStream::cmGeneratedFileStream
          (cmGeneratedFileStream *this,char *name,bool quiet,Encoding encoding)

{
  codecvt *this_00;
  locale local_50;
  locale local_48;
  undefined1 *local_40;
  locale local_38;
  
  local_40 = &(this->super_ofstream).field_0x140;
  std::ios_base::ios_base((ios_base *)local_40);
  *(undefined **)&(this->super_ofstream).field_0x140 = &std::runtime_error::typeinfo;
  *(undefined8 *)&this->field_0x218 = 0;
  *(undefined2 *)&this->field_0x220 = 0;
  *(undefined8 *)&this->field_0x228 = 0;
  *(undefined8 *)&this->field_0x230 = 0;
  *(undefined8 *)&this->field_0x238 = 0;
  *(undefined8 *)&this->field_0x240 = 0;
  cmGeneratedFileStreamBase::cmGeneratedFileStreamBase
            ((cmGeneratedFileStreamBase *)
             &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8,
             name);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__cmGeneratedFileStream_00682d10;
  *(undefined ***)&(this->super_ofstream).field_0x140 = &PTR__cmGeneratedFileStream_00682d38;
  std::ofstream::ofstream
            (this,(char *)&PTR_construction_vtable_24__00682d50,
             (_Ios_Openmode)*(undefined8 *)&(this->super_ofstream).field_0x118);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__cmGeneratedFileStream_00682d10;
  *(undefined ***)&(this->super_ofstream).field_0x140 = &PTR__cmGeneratedFileStream_00682d38;
  if (((this->super_ofstream).field_0x160 & 5) != 0 && !quiet) {
    cmSystemTools::Error
              ("Cannot open file for write: ",*(char **)&(this->super_ofstream).field_0x118,
               (char *)0x0,(char *)0x0);
    cmSystemTools::ReportLastSystemError("");
  }
  if (encoding != None) {
    std::locale::locale(&local_50,
                        (locale *)
                        (&(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                          field_0xd0 +
                        (long)(this->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                              [-3]));
    this_00 = (codecvt *)operator_new(0x20);
    codecvt::codecvt(this_00,encoding);
    std::locale::locale<codecvt>(&local_48,&local_50,this_00);
    std::ios::imbue(&local_38);
    std::locale::~locale(&local_38);
    std::locale::~locale(&local_48);
    std::locale::~locale(&local_50);
  }
  return;
}

Assistant:

cmGeneratedFileStream::cmGeneratedFileStream(const char* name, bool quiet,
                                             Encoding encoding)
  : cmGeneratedFileStreamBase(name)
  , Stream(TempName.c_str())
{
  // Check if the file opened.
  if (!*this && !quiet) {
    cmSystemTools::Error("Cannot open file for write: ",
                         this->TempName.c_str());
    cmSystemTools::ReportLastSystemError("");
  }
#ifdef CMAKE_BUILD_WITH_CMAKE
  if (encoding != codecvt::None) {
    imbue(std::locale(getloc(), new codecvt(encoding)));
  }
#else
  static_cast<void>(encoding);
#endif
}